

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadMesh(ColladaParser *this,Mesh *pMesh)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_51;
  string local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    do {
      do {
        while( true ) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar2 == '\0') {
            return;
          }
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          bVar1 = IsElement(this,"source");
          if (bVar1) {
            ReadSource(this);
          }
          else {
            bVar1 = IsElement(this,"vertices");
            if (bVar1) {
              ReadVertexData(this,pMesh);
            }
            else {
              bVar1 = IsElement(this,"triangles");
              if ((((bVar1) || (bVar1 = IsElement(this,"lines"), bVar1)) ||
                  (bVar1 = IsElement(this,"linestrips"), bVar1)) ||
                 (((bVar1 = IsElement(this,"polygons"), bVar1 ||
                   (bVar1 = IsElement(this,"polylist"), bVar1)) ||
                  ((bVar1 = IsElement(this,"trifans"), bVar1 ||
                   (bVar1 = IsElement(this,"tristrips"), bVar1)))))) {
                ReadIndexData(this,pMesh);
              }
              else {
                SkipElement(this);
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"technique_common");
    } while (iVar2 == 0);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"mesh");
    if (iVar2 != 0) {
      std::__cxx11::string::string((string *)&local_50,"Expected end of <mesh> element.",&local_51);
      ThrowException(this,&local_50);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadMesh(Mesh* pMesh)
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("source"))
            {
                // we have professionals dealing with this
                ReadSource();
            }
            else if (IsElement("vertices"))
            {
                // read per-vertex mesh data
                ReadVertexData(pMesh);
            }
            else if (IsElement("triangles") || IsElement("lines") || IsElement("linestrips")
                || IsElement("polygons") || IsElement("polylist") || IsElement("trifans") || IsElement("tristrips"))
            {
                // read per-index mesh data and faces setup
                ReadIndexData(pMesh);
            }
            else
            {
                // ignore the restf
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "technique_common") == 0)
            {
                // end of another meaningless element - read over it
            }
            else if (strcmp(mReader->getNodeName(), "mesh") == 0)
            {
                // end of <mesh> element - we're done here
                break;
            }
            else
            {
                // everything else should be punished
                ThrowException("Expected end of <mesh> element.");
            }
        }
    }
}